

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::ascii::anon_unknown_3::ParseDouble
          (expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,string *s)

{
  char *first;
  long lVar1;
  long lVar2;
  from_chars_result_t<char> fVar3;
  unexpected_type<const_char_*> local_38;
  char *local_30;
  from_chars_result_t<char> ans;
  double result;
  string *s_local;
  
  first = (char *)::std::__cxx11::string::data();
  lVar1 = ::std::__cxx11::string::data();
  lVar2 = ::std::__cxx11::string::size();
  fVar3 = fast_float::from_chars<double,char>
                    (first,(char *)(lVar1 + lVar2),(double *)&ans.ec,general);
  local_30 = fVar3.ptr;
  ans.ptr._0_4_ = fVar3.ec;
  if ((errc)ans.ptr == 0) {
    nonstd::expected_lite::
    expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<double,_0>(__return_storage_ptr__,(double *)&ans.ec);
  }
  else {
    local_38 = nonstd::expected_lite::make_unexpected<char_const(&)[14]>
                         ((char (*) [14])"Parse failed.");
    nonstd::expected_lite::
    expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<double, std::string> ParseDouble(const std::string &s) {

  // Parse with fast_float
  double result;
  auto ans = fast_float::from_chars(s.data(), s.data() + s.size(), result);
  if (ans.ec != std::errc()) {
    // Current `fast_float` implementation does not report detailed parsing err.
    return nonstd::make_unexpected("Parse failed.");
  }

  return result;
}